

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O3

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket,
          SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar5;
  undefined8 *in_FS_OFFSET;
  
  if (Js::Configuration::Global[0x2c158] == '\x01') {
    uVar4 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    if ((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).heapBucket != heapBucket)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar3) goto LAB_00233a7f;
      *puVar1 = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,this->recycler);
    pSVar5 = &((this->normalData).bucketData[uVar4].pendingEmptyBlockList)->
              super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
    if (pSVar5 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if ((this->normalData).bucketData[uVar4].pendingEmptyBlockListTail !=
          (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar3) {
LAB_00233a7f:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
      }
      (this->normalData).bucketData[uVar4].pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
      pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next = pSVar5;
    (this->normalData).bucketData[uVar4].pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}